

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O2

ShaderVariableManagerGL * __thiscall
Diligent::FixedLinearAllocator::
ConstructArray<Diligent::ShaderVariableManagerGL,std::reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>>,std::reference_wrapper<Diligent::ShaderResourceCacheGL>>
          (FixedLinearAllocator *this,size_t count,
          reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>_>
          *args,reference_wrapper<Diligent::ShaderResourceCacheGL> *args_1)

{
  ShaderResourceCacheType *pSVar1;
  ShaderVariableManagerGL *pSVar2;
  PipelineResourceSignatureType **ppPVar3;
  bool bVar4;
  
  pSVar2 = Allocate<Diligent::ShaderVariableManagerGL>(this,count);
  ppPVar3 = &(pSVar2->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
             m_pSignature;
  while (bVar4 = count != 0, count = count - 1, bVar4) {
    pSVar1 = args_1->_M_data;
    ((ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *)(ppPVar3 + -2))->m_Owner =
         (IObject *)args->_M_data;
    ppPVar3[-1] = (PipelineResourceSignatureType *)pSVar1;
    *ppPVar3 = (PipelineResourceSignatureType *)0x0;
    ppPVar3[1] = (PipelineResourceSignatureType *)0x0;
    ppPVar3[2] = (PipelineResourceSignatureType *)0x0;
    ppPVar3[3] = (PipelineResourceSignatureType *)0x0;
    ppPVar3 = ppPVar3 + 6;
  }
  return pSVar2;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }